

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void output_bitmap(gen_ctx_t gen_ctx,char *head,bitmap_t bm,int print_name_p,MIR_reg_t *reg_map)

{
  MIR_context_t ctx;
  FILE *__stream;
  int iVar1;
  MIR_type_t tp;
  char *pcVar2;
  char *pcVar3;
  MIR_reg_t reg;
  size_t sVar4;
  size_t nel;
  bitmap_iterator_t bi;
  
  if (bm != (bitmap_t)0x0) {
    ctx = gen_ctx->ctx;
    iVar1 = bitmap_empty_p(bm);
    if (iVar1 == 0) {
      fputs(head,(FILE *)gen_ctx->debug_file);
      bi.nbit = 0;
      bi.bitmap = bm;
      while( true ) {
        do {
          iVar1 = bitmap_iterator_next(&bi,&nel);
          sVar4 = nel;
          if (iVar1 == 0) {
            fputc(10,(FILE *)gen_ctx->debug_file);
            return;
          }
          fprintf((FILE *)gen_ctx->debug_file," %3lu",nel);
        } while ((print_name_p == 0) || (reg_map == (MIR_reg_t *)0x0 && sVar4 < 0x22));
        if (reg_map != (MIR_reg_t *)0x0) {
          sVar4 = (size_t)reg_map[sVar4];
        }
        if ((uint)sVar4 < 0x21) break;
        reg = (uint)sVar4 - 0x21;
        __stream = (FILE *)gen_ctx->debug_file;
        tp = MIR_reg_type(ctx,reg,(gen_ctx->curr_func_item->u).func);
        pcVar2 = MIR_type_str(ctx,tp);
        pcVar3 = MIR_reg_name(ctx,reg,(gen_ctx->curr_func_item->u).func);
        fprintf(__stream,"(%s:%s)",pcVar2,pcVar3);
      }
      __assert_fail("reg >= ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x535,"void output_bitmap(gen_ctx_t, const char *, bitmap_t, int, MIR_reg_t *)"
                   );
    }
  }
  return;
}

Assistant:

static void output_bitmap (gen_ctx_t gen_ctx, const char *head, bitmap_t bm, int print_name_p,
                           MIR_reg_t *reg_map) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t reg;
  size_t nel;
  bitmap_iterator_t bi;

  if (bm == NULL || bitmap_empty_p (bm)) return;
  fprintf (debug_file, "%s", head);
  FOREACH_BITMAP_BIT (bi, bm, nel) {
    fprintf (debug_file, " %3lu", (unsigned long) nel);
    if (print_name_p && (reg_map != NULL || nel > MAX_HARD_REG)) {
      reg = (MIR_reg_t) nel;
      if (reg_map != NULL) reg = reg_map[nel];
      gen_assert (reg >= MAX_HARD_REG);
      fprintf (debug_file, "(%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func)),
               MIR_reg_name (ctx, reg - MAX_HARD_REG, curr_func_item->u.func));
    }
  }
  fprintf (debug_file, "\n");
}